

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::CountBitsFunction::checkArguments
          (CountBitsFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *pEVar2;
  pointer ppEVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  Type *pTVar7;
  SourceLocation SVar8;
  long lVar9;
  SourceRange sourceRange;
  
  SVar8 = range.startLoc;
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar5 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,2,0x7fffffff);
  if (bVar5) {
    bVar5 = Type::isBitstreamType(((*args->_M_ptr)->type).ptr,false);
    pEVar2 = *args->_M_ptr;
    if (!bVar5) {
      pTVar7 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,pEVar2);
      return pTVar7;
    }
    sourceRange.endLoc = SVar8;
    sourceRange.startLoc = (pEVar2->sourceRange).endLoc;
    bVar5 = Bitstream::checkClassAccess
                      ((Bitstream *)(pEVar2->type).ptr,(Type *)context,
                       (ASTContext *)(pEVar2->sourceRange).startLoc,sourceRange);
    if (bVar5) {
      ppEVar3 = args->_M_ptr;
      lVar9 = (args->_M_extent)._M_extent_value << 3;
      lVar4 = 8;
      do {
        lVar6 = lVar4;
        if (lVar9 == lVar6) break;
        pEVar2 = *(Expression **)((long)ppEVar3 + lVar6);
        bVar5 = Type::isIntegral((pEVar2->type).ptr);
        if (!bVar5) {
          args = (Args *)SystemSubroutine::badArg(&this->super_SystemSubroutine,context,pEVar2);
        }
        lVar4 = lVar6 + 8;
      } while (bVar5);
      if (lVar9 != lVar6) {
        return (Type *)args;
      }
      return pCVar1->intType;
    }
  }
  return pCVar1->errorType;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        if (!args[0]->type->isBitstreamType())
            return badArg(context, *args[0]);

        if (!Bitstream::checkClassAccess(*args[0]->type, context, args[0]->sourceRange))
            return comp.getErrorType();

        for (auto arg : args.subspan(1)) {
            if (!arg->type->isIntegral())
                return badArg(context, *arg);
        }

        return comp.getIntType();
    }